

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DecoratorNinePatch.cpp
# Opt level: O3

bool __thiscall
Rml::DecoratorNinePatch::Initialise
          (DecoratorNinePatch *this,Rectanglef *_rect_outer,Rectanglef *_rect_inner,
          Array<NumericValue,_4> *_edges,Texture _texture,float _display_scale)

{
  array<Rml::NumericValue,_4UL> *paVar1;
  Vector2Type VVar2;
  NumericValue NVar3;
  NumericValue NVar4;
  NumericValue NVar5;
  int iVar6;
  array<Rml::NumericValue,_4UL> *paVar7;
  
  VVar2 = _rect_outer->p1;
  (this->rect_outer).p0 = _rect_outer->p0;
  (this->rect_outer).p1 = VVar2;
  VVar2 = _rect_inner->p1;
  (this->rect_inner).p0 = _rect_inner->p0;
  (this->rect_inner).p1 = VVar2;
  this->display_scale = _display_scale;
  if (_edges != (Array<NumericValue,_4> *)0x0) {
    paVar7 = (array<Rml::NumericValue,_4UL> *)operator_new(0x20);
    NVar3 = _edges->_M_elems[1];
    NVar4 = _edges->_M_elems[2];
    NVar5 = _edges->_M_elems[3];
    paVar7->_M_elems[0] = _edges->_M_elems[0];
    paVar7->_M_elems[1] = NVar3;
    paVar7->_M_elems[2] = NVar4;
    paVar7->_M_elems[3] = NVar5;
    paVar1 = (this->edges)._M_t.
             super___uniq_ptr_impl<std::array<Rml::NumericValue,_4UL>,_std::default_delete<std::array<Rml::NumericValue,_4UL>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_std::array<Rml::NumericValue,_4UL>_*,_std::default_delete<std::array<Rml::NumericValue,_4UL>_>_>
             .super__Head_base<0UL,_std::array<Rml::NumericValue,_4UL>_*,_false>._M_head_impl;
    (this->edges)._M_t.
    super___uniq_ptr_impl<std::array<Rml::NumericValue,_4UL>,_std::default_delete<std::array<Rml::NumericValue,_4UL>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::array<Rml::NumericValue,_4UL>_*,_std::default_delete<std::array<Rml::NumericValue,_4UL>_>_>
    .super__Head_base<0UL,_std::array<Rml::NumericValue,_4UL>_*,_false>._M_head_impl = paVar7;
    if (paVar1 != (array<Rml::NumericValue,_4UL> *)0x0) {
      operator_delete(paVar1,0x20);
    }
  }
  iVar6 = Decorator::AddTexture(&this->super_Decorator,_texture);
  return -1 < iVar6;
}

Assistant:

bool DecoratorNinePatch::Initialise(const Rectanglef& _rect_outer, const Rectanglef& _rect_inner, const Array<NumericValue, 4>* _edges,
	Texture _texture, float _display_scale)
{
	rect_outer = _rect_outer;
	rect_inner = _rect_inner;

	display_scale = _display_scale;

	if (_edges)
		edges = MakeUnique<Array<NumericValue, 4>>(*_edges);

	int texture_index = AddTexture(_texture);
	return (texture_index >= 0);
}